

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Deserializer.cpp
# Opt level: O2

void __thiscall
adios2::format::BP5Deserializer::StructQueueReadChecks
          (BP5Deserializer *this,VariableStruct *variable,BP5VarRec *VarRec)

{
  StructDefinition *pSVar1;
  StructDefinition *pSVar2;
  allocator local_bb;
  allocator local_ba;
  allocator local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  string local_78;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pSVar1 = VarRec->ReaderDef;
  pSVar2 = variable->m_ReadStructDefinition;
  if (pSVar2 == (StructDefinition *)0x0) {
    std::__cxx11::string::string((string *)&local_58,"Toolkit",(allocator *)&local_38);
    std::__cxx11::string::string((string *)&local_78,"format::BP5Deserializer",&local_ba);
    std::__cxx11::string::string((string *)&local_98,"QueueGet",&local_bb);
    std::operator+(&local_b8,"ReadStructure not defined for variable ",
                   &(variable->super_VariableBase).m_Name);
    helper::Throw<std::logic_error>(&local_58,&local_78,&local_98,&local_b8,-1);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
    pSVar2 = variable->m_ReadStructDefinition;
  }
  if (pSVar2 != pSVar1) {
    if (pSVar1 != (StructDefinition *)0x0) {
      std::__cxx11::string::string((string *)&local_58,"Toolkit",&local_ba);
      std::__cxx11::string::string((string *)&local_78,"format::BP5Deserializer",&local_bb);
      std::__cxx11::string::string((string *)&local_98,"QueueGet",&local_b9);
      std::operator+(&local_38,"ReadStructure definition for variable ",
                     &(variable->super_VariableBase).m_Name);
      std::operator+(&local_b8,&local_38," changed from prior definition.  Unsupported.");
      helper::Throw<std::logic_error>(&local_58,&local_78,&local_98,&local_b8,-1);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_38);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_58);
      pSVar2 = variable->m_ReadStructDefinition;
    }
    VarRec->ReaderDef = pSVar2;
  }
  return;
}

Assistant:

void BP5Deserializer::StructQueueReadChecks(core::VariableStruct *variable, BP5VarRec *VarRec)
{
    auto EngineReadDef = VarRec->ReaderDef;
    // If there is no ReadDefinition, that's an error
    if (!variable->m_ReadStructDefinition)
        helper::Throw<std::logic_error>("Toolkit", "format::BP5Deserializer", "QueueGet",
                                        "ReadStructure not defined for variable " +
                                            variable->m_Name);

    // If there was a prior read def and the current is the same, that's fine
    if (variable->m_ReadStructDefinition == EngineReadDef)
        return;

    // If there was a prior read definition and this one is different, throw
    if (EngineReadDef)
        helper::Throw<std::logic_error>("Toolkit", "format::BP5Deserializer", "QueueGet",
                                        "ReadStructure definition for variable " +
                                            variable->m_Name +
                                            " changed from prior definition.  Unsupported.");

    // Check to see if the read definition is compatible with the write
    // definition (and the engine can support the transformation)

    // OK, use this
    VarRec->ReaderDef = variable->m_ReadStructDefinition;
}